

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitBitVector.h
# Opt level: O0

BVIndex BVUnitT<unsigned_long>::CountBit(UnitWord64 bits)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  BVIndex BVar4;
  ulong uVar5;
  undefined4 *puVar6;
  uint64 _F1_64;
  uint64 _3_64;
  uint64 _5_64;
  uint countBits;
  UnitWord64 bits_local;
  
  BVar3 = CountBit((UnitWord32)bits);
  BVar4 = CountBit((UnitWord32)(bits >> 0x20));
  uVar5 = bits - (bits >> 1 & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar5 = (uVar5 >> 4 & 0xf0f0f0f0f0f0f0f) + (uVar5 & 0xf0f0f0f0f0f0f0f);
  uVar5 = (uVar5 >> 8) + uVar5;
  uVar5 = (uVar5 >> 0x10) + uVar5;
  uVar5 = (uVar5 >> 0x20) + uVar5;
  if ((ulong)(BVar3 + BVar4) != (uVar5 & 0xff)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/UnitBitVector.h"
                       ,0xa8,"(countBits == (bits & 0xff))","Wrong count?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return (uint)uVar5 & 0xff;
}

Assistant:

static BVIndex CountBit(UnitWord64 bits)
    {
#if DBG
        unsigned countBits = CountBit((UnitWord32)bits) + CountBit((UnitWord32)(bits >> 32));
#endif

        const uint64 _5_64 =     0x5555555555555555ui64;
        const uint64 _3_64 =     0x3333333333333333ui64;
        const uint64 _F1_64 =    0x0f0f0f0f0f0f0f0fui64;

        // In-place adder tree: perform 32 1-bit adds, 16 2-bit adds, 8 4-bit adds,
        // 4 8-bit adds, 2 16-bit adds, and 1 32-bit add.
        // From Dr. Dobb's Nov. 2000 letters, from Phil Bagwell, on reducing
        // the cost by removing some of the masks that can be "forgotten" due
        // to the max # of bits set (64) that will fit in a byte.
        //

        bits -= (bits >> 1) & _5_64;
        bits = ((bits >> 2) & _3_64)  + (bits & _3_64);
        bits = ((bits >> 4) & _F1_64) + (bits & _F1_64);
        bits += bits >> 8;
        bits += bits >> 16;
        bits += bits >> 32;

        AssertMsg(countBits == (bits & 0xff), "Wrong count?");

        return (BVIndex)(bits & 0xff);
    }